

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O2

int __thiscall helics::Input::getComplexValue(Input *this,double *data,int maxsize)

{
  pointer __src;
  int iVar1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *pvVar2;
  int iVar3;
  
  pvVar2 = getValueRef<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>(this)
  ;
  iVar3 = 0;
  if (0 < maxsize && data != (double *)0x0) {
    __src = (pvVar2->
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
    iVar1 = (int)((ulong)((long)(pvVar2->
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)__src) >> 4);
    iVar3 = maxsize;
    if (iVar1 < maxsize) {
      iVar3 = iVar1;
    }
    memmove(data,__src,(long)iVar3 << 4);
  }
  this->hasUpdate = false;
  return iVar3;
}

Assistant:

int Input::getComplexValue(double* data, int maxsize)
{
    const auto& CV = getValueRef<std::vector<std::complex<double>>>();
    int length = 0;
    if (data != nullptr && maxsize > 0) {
        length = std::min(static_cast<int>(CV.size()), maxsize);
        std::memmove(data, reinterpret_cast<const double*>(CV.data()), length * sizeof(double) * 2);
    }

    hasUpdate = false;
    return length;
}